

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

v_field ConstTpl::readHandleSelector(string *name)

{
  bool bVar1;
  v_field vVar2;
  LowlevelError *this;
  allocator local_39;
  string local_38;
  
  bVar1 = std::operator==(name,"space");
  vVar2 = v_space;
  if (!bVar1) {
    bVar1 = std::operator==(name,"offset");
    if (bVar1) {
      vVar2 = v_offset;
    }
    else {
      bVar1 = std::operator==(name,"size");
      if (bVar1) {
        vVar2 = v_size;
      }
      else {
        bVar1 = std::operator==(name,"offset_plus");
        if (!bVar1) {
          this = (LowlevelError *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string((string *)&local_38,"Bad handle selector",&local_39);
          LowlevelError::LowlevelError(this,&local_38);
          __cxa_throw(this,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        vVar2 = v_offset_plus;
      }
    }
  }
  return vVar2;
}

Assistant:

ConstTpl::v_field ConstTpl::readHandleSelector(const string &name)

{
  if (name == "space")
    return v_space;
  if (name == "offset")
    return v_offset;
  if (name == "size")
    return v_size;
  if (name == "offset_plus")
    return v_offset_plus;
  throw LowlevelError("Bad handle selector");
}